

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

decimal_fp<double> fmt::v10::detail::dragonbox::to_decimal<double>(double x)

{
  bool bVar1;
  compute_mul_parity_result cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  uint uVar7;
  unsigned_long uVar8;
  carrier_uint cVar9;
  uint64_t uVar10;
  double dVar11;
  compute_mul_result cVar12;
  decimal_fp<double> dVar13;
  double local_218;
  bool local_1a8;
  bool bStack_1a7;
  uint local_1a4;
  compute_mul_parity_result y_mul;
  bool divisible_by_small_divisor;
  bool approx_y_parity;
  uint32_t dist;
  compute_mul_parity_result x_mul;
  uint32_t r;
  compute_mul_result z_mul;
  carrier_uint two_fc;
  uint32_t deltai;
  int beta;
  cache_entry_type cache;
  int minus_k;
  bool include_right_endpoint;
  bool include_left_endpoint;
  ulong uStack_158;
  int exponent;
  carrier_uint significand;
  carrier_uint significand_mask;
  unsigned_long br;
  double x_local;
  decimal_fp<double> ret_value;
  carrier_uint zi;
  carrier_uint xi;
  cache_entry_type cache_1;
  int beta_1;
  int minus_k_1;
  decimal_fp<double> ret_value_1;
  uint64_t q;
  uint64_t q_3;
  int s;
  uint64_t mod_inv_25;
  uint64_t mod_inv_5;
  int s_1;
  uint32_t n32;
  uint128_fallback nm;
  uint64_t magic_number;
  uint local_98;
  uint32_t q_1;
  uint32_t q_2;
  uint32_t mod_inv_25_1;
  uint32_t mod_inv_5_1;
  uint64_t q_4;
  uint64_t q_7;
  int s_2;
  uint64_t mod_inv_25_2;
  uint64_t mod_inv_5_2;
  int s_3;
  uint32_t n32_1;
  uint128_fallback nm_1;
  uint64_t magic_number_1;
  uint local_28;
  uint32_t q_5;
  uint32_t q_6;
  uint32_t mod_inv_25_3;
  uint32_t mod_inv_5_3;
  
  br = (unsigned_long)x;
  uVar8 = bit_cast<unsigned_long,_double,_0>((double *)&br);
  uStack_158 = uVar8 & 0xfffffffffffff;
  cVar9 = exponent_mask<double>();
  iVar3 = num_significand_bits<double>();
  iVar3 = (int)((uVar8 & cVar9) >> ((byte)iVar3 & 0x3f));
  if (iVar3 == 0) {
    if (uStack_158 == 0) {
      x_local = 0.0;
      ret_value.significand._0_4_ = 0;
      goto LAB_0030a45b;
    }
    iVar3 = num_significand_bits<double>();
    minus_k = -0x3fe - iVar3;
  }
  else {
    iVar4 = exponent_bias<double>();
    iVar5 = num_significand_bits<double>();
    minus_k = iVar3 - (iVar4 + iVar5);
    if (uStack_158 == 0) {
      ret_value_1.significand._0_4_ = floor_log10_pow2_minus_log10_4_over_3(minus_k);
      iVar3 = floor_log2_pow10(-(int)ret_value_1.significand);
      cache_1.hi_._4_4_ = minus_k + iVar3;
      _xi = cache_accessor<double>::get_cached_power(-(int)ret_value_1.significand);
      zi = cache_accessor<double>::compute_left_endpoint_for_shorter_interval_case
                     ((cache_entry_type *)&xi,cache_1.hi_._4_4_);
      ret_value._8_8_ =
           cache_accessor<double>::compute_right_endpoint_for_shorter_interval_case
                     ((cache_entry_type *)&xi,cache_1.hi_._4_4_);
      bVar1 = is_left_endpoint_integer_shorter_interval<double>(minus_k);
      if (!bVar1) {
        zi = zi + 1;
      }
      _minus_k_1 = (double)((ulong)ret_value._8_8_ / 10);
      if ((ulong)((long)_minus_k_1 * 10) < zi) {
        local_218 = (double)cache_accessor<double>::compute_round_up_for_shorter_interval_case
                                      ((cache_entry_type *)&xi,cache_1.hi_._4_4_);
        if ((minus_k < -0x4d) || (-0x4d < minus_k)) {
          _minus_k_1 = local_218;
          if ((ulong)local_218 < zi) {
            _minus_k_1 = (double)((long)local_218 + 1);
          }
        }
        else {
          if (((ulong)local_218 & 1) != 0) {
            local_218 = (double)((long)local_218 - 1);
          }
          _minus_k_1 = local_218;
        }
      }
      else {
        if (_minus_k_1 == 0.0) {
          assert_fail("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/fmtlib/repo/include/fmt/format-inl.h"
                      ,0x487,anon_var_dwarf_260822 + 9);
        }
        nm.hi_ = 0xabcc77118461cefd;
        _s_1 = umul128((uint64_t)_minus_k_1,0xabcc77118461cefd);
        uVar10 = uint128_fallback::high((uint128_fallback *)&s_1);
        if (((uVar10 & 0x3ffffff) == 0) &&
           (uVar10 = uint128_fallback::low((uint128_fallback *)&s_1), uVar10 < 0xabcc77118461cefd))
        {
          uVar10 = uint128_fallback::high((uint128_fallback *)&s_1);
          mod_inv_5._4_4_ = (uint32_t)(uVar10 >> 0x1a);
          mod_inv_25_1 = 8;
          if (mod_inv_5._4_4_ == 0) {
            assert_fail("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/fmtlib/repo/include/fmt/format-inl.h"
                        ,0x472,anon_var_dwarf_260822 + 9);
          }
          while( true ) {
            uVar6 = rotr(mod_inv_5._4_4_ * -0x3d70a3d7,2);
            uVar7 = max_value<unsigned_int>();
            if (uVar7 / 100 < uVar6) break;
            mod_inv_25_1 = mod_inv_25_1 + 2;
            mod_inv_5._4_4_ = uVar6;
          }
          uVar6 = rotr(mod_inv_5._4_4_ * -0x33333333,1);
          uVar7 = max_value<unsigned_int>();
          if (uVar6 <= uVar7 / 10) {
            mod_inv_25_1 = mod_inv_25_1 | 1;
            mod_inv_5._4_4_ = uVar6;
          }
          _minus_k_1 = (double)(ulong)mod_inv_5._4_4_;
          local_98 = mod_inv_25_1;
        }
        else {
          q_3._4_4_ = 0;
          while( true ) {
            dVar11 = (double)rotr((long)_minus_k_1 * -0x70a3d70a3d70a3d7,2);
            uVar8 = max_value<unsigned_long>();
            if (uVar8 / 100 < (ulong)dVar11) break;
            q_3._4_4_ = q_3._4_4_ + 2;
            _minus_k_1 = dVar11;
          }
          dVar11 = (double)rotr((long)_minus_k_1 * -0x3333333333333333,1);
          uVar8 = max_value<unsigned_long>();
          if ((ulong)dVar11 <= uVar8 / 10) {
            q_3._4_4_ = q_3._4_4_ | 1;
            _minus_k_1 = dVar11;
          }
          local_98 = q_3._4_4_;
        }
        ret_value_1.significand._0_4_ = local_98 + (int)ret_value_1.significand + 1;
      }
      x_local = _minus_k_1;
      ret_value.significand._0_4_ = (int)ret_value_1.significand;
      goto LAB_0030a45b;
    }
    iVar3 = num_significand_bits<double>();
    uStack_158 = 1L << ((byte)iVar3 & 0x3f) | uStack_158;
  }
  bVar1 = (uStack_158 & 1) == 0;
  iVar3 = floor_log10_pow2(minus_k);
  cache.hi_._4_4_ = iVar3 + -2;
  _deltai = cache_accessor<double>::get_cached_power(-cache.hi_._4_4_);
  iVar3 = floor_log2_pow10(-cache.hi_._4_4_);
  iVar3 = minus_k + iVar3;
  uVar6 = cache_accessor<double>::compute_delta((cache_entry_type *)&deltai,iVar3);
  uStack_158 = uStack_158 * 2;
  cVar12 = cache_accessor<double>::compute_mul
                     ((uStack_158 | 1) << ((byte)iVar3 & 0x3f),(cache_entry_type *)&deltai);
  x_local = (double)divide_by_10_to_kappa_plus_1(cVar12.result);
  dist = (int)cVar12.result + SUB84(x_local,0) * -1000;
  if (dist < uVar6) {
    if ((dist != 0) || ((cVar12.is_integer & 1U & !bVar1) == 0)) {
LAB_0030a044:
      ret_value.significand._0_4_ = cache.hi_._4_4_ + 3;
      if (x_local == 0.0) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/fmtlib/repo/include/fmt/format-inl.h"
                    ,0x487,anon_var_dwarf_260822 + 9);
      }
      nm_1.hi_ = 0xabcc77118461cefd;
      _s_3 = umul128((uint64_t)x_local,0xabcc77118461cefd);
      uVar10 = uint128_fallback::high((uint128_fallback *)&s_3);
      if (((uVar10 & 0x3ffffff) == 0) &&
         (uVar10 = uint128_fallback::low((uint128_fallback *)&s_3), uVar10 < 0xabcc77118461cefd)) {
        uVar10 = uint128_fallback::high((uint128_fallback *)&s_3);
        mod_inv_5_2._4_4_ = (uint32_t)(uVar10 >> 0x1a);
        mod_inv_25_3 = 8;
        if (mod_inv_5_2._4_4_ == 0) {
          assert_fail("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/fmtlib/repo/include/fmt/format-inl.h"
                      ,0x472,anon_var_dwarf_260822 + 9);
        }
        while( true ) {
          uVar6 = rotr(mod_inv_5_2._4_4_ * -0x3d70a3d7,2);
          uVar7 = max_value<unsigned_int>();
          if (uVar7 / 100 < uVar6) break;
          mod_inv_25_3 = mod_inv_25_3 + 2;
          mod_inv_5_2._4_4_ = uVar6;
        }
        uVar6 = rotr(mod_inv_5_2._4_4_ * -0x33333333,1);
        uVar7 = max_value<unsigned_int>();
        if (uVar6 <= uVar7 / 10) {
          mod_inv_25_3 = mod_inv_25_3 | 1;
          mod_inv_5_2._4_4_ = uVar6;
        }
        x_local = (double)(ulong)mod_inv_5_2._4_4_;
        local_28 = mod_inv_25_3;
      }
      else {
        q_7._4_4_ = 0;
        while( true ) {
          dVar11 = (double)rotr((long)x_local * -0x70a3d70a3d70a3d7,2);
          uVar8 = max_value<unsigned_long>();
          if (uVar8 / 100 < (ulong)dVar11) break;
          q_7._4_4_ = q_7._4_4_ + 2;
          x_local = dVar11;
        }
        dVar11 = (double)rotr((long)x_local * -0x3333333333333333,1);
        uVar8 = max_value<unsigned_long>();
        if ((ulong)dVar11 <= uVar8 / 10) {
          q_7._4_4_ = q_7._4_4_ | 1;
          x_local = dVar11;
        }
        local_28 = q_7._4_4_;
      }
      ret_value.significand._0_4_ = local_28 + (int)ret_value.significand;
      goto LAB_0030a45b;
    }
    x_local = (double)((long)x_local - 1);
    dist = 1000;
  }
  else if (dist <= uVar6) {
    cVar2 = cache_accessor<double>::compute_mul_parity
                      (uStack_158 - 1,(cache_entry_type *)&deltai,iVar3);
    approx_y_parity = cVar2.is_integer;
    if (((ushort)cVar2 & 1) != 0 || (approx_y_parity & 1U & bVar1) != 0) goto LAB_0030a044;
  }
  x_local = (double)((long)x_local * 10);
  ret_value.significand._0_4_ = cache.hi_._4_4_ + 2;
  local_1a4 = (dist - (uVar6 >> 1)) + 0x32;
  uVar7 = local_1a4 & 1;
  bVar1 = check_divisibility_and_divide_by_pow10<2>(&local_1a4);
  x_local = (double)((ulong)local_1a4 + (long)x_local);
  if (bVar1) {
    cVar2 = cache_accessor<double>::compute_mul_parity(uStack_158,(cache_entry_type *)&deltai,iVar3)
    ;
    local_1a8 = cVar2.parity;
    if ((bool)(local_1a8 & 1U) == (uVar7 != 0)) {
      bStack_1a7 = cVar2.is_integer;
      if ((bStack_1a7 & 1U & ((ulong)x_local & 1) != 0) != 0) {
        x_local = (double)((long)x_local + -1);
      }
    }
    else {
      x_local = (double)((long)x_local + -1);
    }
  }
LAB_0030a45b:
  dVar13.exponent = (int)ret_value.significand;
  dVar13.significand = (significand_type)x_local;
  dVar13._12_4_ = 0;
  return dVar13;
}

Assistant:

auto to_decimal(T x) noexcept -> decimal_fp<T> {
  // Step 1: integer promotion & Schubfach multiplier calculation.

  using carrier_uint = typename float_info<T>::carrier_uint;
  using cache_entry_type = typename cache_accessor<T>::cache_entry_type;
  auto br = bit_cast<carrier_uint>(x);

  // Extract significand bits and exponent bits.
  const carrier_uint significand_mask =
      (static_cast<carrier_uint>(1) << num_significand_bits<T>()) - 1;
  carrier_uint significand = (br & significand_mask);
  int exponent =
      static_cast<int>((br & exponent_mask<T>()) >> num_significand_bits<T>());

  if (exponent != 0) {  // Check if normal.
    exponent -= exponent_bias<T>() + num_significand_bits<T>();

    // Shorter interval case; proceed like Schubfach.
    // In fact, when exponent == 1 and significand == 0, the interval is
    // regular. However, it can be shown that the end-results are anyway same.
    if (significand == 0) return shorter_interval_case<T>(exponent);

    significand |= (static_cast<carrier_uint>(1) << num_significand_bits<T>());
  } else {
    // Subnormal case; the interval is always regular.
    if (significand == 0) return {0, 0};
    exponent =
        std::numeric_limits<T>::min_exponent - num_significand_bits<T>() - 1;
  }

  const bool include_left_endpoint = (significand % 2 == 0);
  const bool include_right_endpoint = include_left_endpoint;

  // Compute k and beta.
  const int minus_k = floor_log10_pow2(exponent) - float_info<T>::kappa;
  const cache_entry_type cache = cache_accessor<T>::get_cached_power(-minus_k);
  const int beta = exponent + floor_log2_pow10(-minus_k);

  // Compute zi and deltai.
  // 10^kappa <= deltai < 10^(kappa + 1)
  const uint32_t deltai = cache_accessor<T>::compute_delta(cache, beta);
  const carrier_uint two_fc = significand << 1;

  // For the case of binary32, the result of integer check is not correct for
  // 29711844 * 2^-82
  // = 6.1442653300000000008655037797566933477355632930994033813476... * 10^-18
  // and 29711844 * 2^-81
  // = 1.2288530660000000001731007559513386695471126586198806762695... * 10^-17,
  // and they are the unique counterexamples. However, since 29711844 is even,
  // this does not cause any problem for the endpoints calculations; it can only
  // cause a problem when we need to perform integer check for the center.
  // Fortunately, with these inputs, that branch is never executed, so we are
  // fine.
  const typename cache_accessor<T>::compute_mul_result z_mul =
      cache_accessor<T>::compute_mul((two_fc | 1) << beta, cache);

  // Step 2: Try larger divisor; remove trailing zeros if necessary.

  // Using an upper bound on zi, we might be able to optimize the division
  // better than the compiler; we are computing zi / big_divisor here.
  decimal_fp<T> ret_value;
  ret_value.significand = divide_by_10_to_kappa_plus_1(z_mul.result);
  uint32_t r = static_cast<uint32_t>(z_mul.result - float_info<T>::big_divisor *
                                                        ret_value.significand);

  if (r < deltai) {
    // Exclude the right endpoint if necessary.
    if (r == 0 && (z_mul.is_integer & !include_right_endpoint)) {
      --ret_value.significand;
      r = float_info<T>::big_divisor;
      goto small_divisor_case_label;
    }
  } else if (r > deltai) {
    goto small_divisor_case_label;
  } else {
    // r == deltai; compare fractional parts.
    const typename cache_accessor<T>::compute_mul_parity_result x_mul =
        cache_accessor<T>::compute_mul_parity(two_fc - 1, cache, beta);

    if (!(x_mul.parity | (x_mul.is_integer & include_left_endpoint)))
      goto small_divisor_case_label;
  }
  ret_value.exponent = minus_k + float_info<T>::kappa + 1;

  // We may need to remove trailing zeros.
  ret_value.exponent += remove_trailing_zeros(ret_value.significand);
  return ret_value;

  // Step 3: Find the significand with the smaller divisor.

small_divisor_case_label:
  ret_value.significand *= 10;
  ret_value.exponent = minus_k + float_info<T>::kappa;

  uint32_t dist = r - (deltai / 2) + (float_info<T>::small_divisor / 2);
  const bool approx_y_parity =
      ((dist ^ (float_info<T>::small_divisor / 2)) & 1) != 0;

  // Is dist divisible by 10^kappa?
  const bool divisible_by_small_divisor =
      check_divisibility_and_divide_by_pow10<float_info<T>::kappa>(dist);

  // Add dist / 10^kappa to the significand.
  ret_value.significand += dist;

  if (!divisible_by_small_divisor) return ret_value;

  // Check z^(f) >= epsilon^(f).
  // We have either yi == zi - epsiloni or yi == (zi - epsiloni) - 1,
  // where yi == zi - epsiloni if and only if z^(f) >= epsilon^(f).
  // Since there are only 2 possibilities, we only need to care about the
  // parity. Also, zi and r should have the same parity since the divisor
  // is an even number.
  const auto y_mul = cache_accessor<T>::compute_mul_parity(two_fc, cache, beta);

  // If z^(f) >= epsilon^(f), we might have a tie when z^(f) == epsilon^(f),
  // or equivalently, when y is an integer.
  if (y_mul.parity != approx_y_parity)
    --ret_value.significand;
  else if (y_mul.is_integer & (ret_value.significand % 2 != 0))
    --ret_value.significand;
  return ret_value;
}